

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

QVBoxLayout * __thiscall
Panel::createLayout(Panel *this,array<std::function<void_()>,_3UL> *panelSlots,
                   QMainWindow *mainWindow)

{
  QWidget *pQVar1;
  type *ptVar2;
  type *ptVar3;
  bool bVar4;
  mapped_type *pmVar5;
  QVBoxLayout *pQVar6;
  QGroupBox *pQVar7;
  mapped_type *pmVar8;
  QPushButton *pQVar9;
  reference pvVar10;
  _Elements<1UL> *__self;
  _Elements<1UL> *__self_00;
  map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_BoardSize,_QRadioButton>_>,_bool> pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_BoardMode,_QRadioButton>_>,_bool> pVar12;
  QFlags<Qt::AlignmentFlag> local_34c;
  QFlags<Qt::AlignmentFlag> local_348;
  QFlags<Qt::AlignmentFlag> local_344;
  QFlags<Qt::AlignmentFlag> local_340;
  QFlags<Qt::AlignmentFlag> local_33c;
  QWidget *local_338;
  QVBoxLayout *panelLayout;
  undefined8 local_328;
  function<void_()> local_320;
  Object local_300 [8];
  QString local_2f8;
  undefined1 local_2d9;
  QString local_2d8;
  QPushButton *local_2c0;
  QPushButton *pushUndo;
  undefined8 local_2b0;
  function<void_()> local_2a8;
  Object local_288 [8];
  QString local_280;
  undefined1 local_261;
  QString local_260;
  QPushButton *local_248;
  QPushButton *pushSolve;
  undefined8 local_238;
  function<void_()> local_230;
  Object local_210 [8];
  QString local_208;
  undefined1 local_1e9;
  QString local_1e8;
  QPushButton *local_1d0;
  QPushButton *pushRandom;
  QString local_1c0;
  QGroupBox *local_1a8;
  QGroupBox *radioModeBox;
  QFlags<Qt::AlignmentFlag> local_184;
  type *local_180;
  type *radio_1;
  _Iterator<true> __end1_1;
  _Iterator<true> __begin1_1;
  elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
  *__range1_1;
  QVBoxLayout *radioModeLayout;
  _Base_ptr local_140;
  undefined1 local_138;
  BoardMode local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  BoardMode local_118;
  undefined1 local_111;
  QString local_110;
  QGroupBox *local_f8;
  QGroupBox *radioSizeBox;
  QFlags<Qt::AlignmentFlag> local_d4;
  type *local_d0;
  type *radio;
  _Iterator<true> __end1;
  _Iterator<true> __begin1;
  elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
  *__range1;
  QVBoxLayout *radioSizeLayout;
  _Base_ptr local_80;
  undefined1 local_78;
  BoardSize local_6c;
  _Base_ptr local_68;
  undefined1 local_60;
  BoardSize local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  BoardSize local_3c;
  _Base_ptr local_38;
  undefined1 local_30;
  BoardSize local_24;
  QMainWindow *local_20;
  QMainWindow *mainWindow_local;
  array<std::function<void_()>,_3UL> *panelSlots_local;
  Panel *this_local;
  
  local_24 = FOUR;
  local_20 = mainWindow;
  mainWindow_local = (QMainWindow *)panelSlots;
  panelSlots_local = (array<std::function<void_()>,_3UL> *)this;
  pVar11 = std::
           map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
           ::emplace<BoardSize,char_const(&)[2]>
                     ((map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
                       *)this,&local_24,(char (*) [2])0x141c26);
  local_38 = (_Base_ptr)pVar11.first._M_node;
  local_30 = pVar11.second;
  local_3c = FIVE;
  pVar11 = std::
           map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
           ::emplace<BoardSize,char_const(&)[2]>
                     ((map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
                       *)this,&local_3c,(char (*) [2])0x141d18);
  local_50 = (_Base_ptr)pVar11.first._M_node;
  local_48 = pVar11.second;
  local_54 = SIX;
  pVar11 = std::
           map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
           ::emplace<BoardSize,char_const(&)[2]>
                     ((map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
                       *)this,&local_54,(char (*) [2])0x141c5a);
  local_68 = (_Base_ptr)pVar11.first._M_node;
  local_60 = pVar11.second;
  local_6c = SEVEN;
  pVar11 = std::
           map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
           ::emplace<BoardSize,char_const(&)[2]>
                     ((map<BoardSize,QRadioButton,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
                       *)this,&local_6c,(char (*) [2])0x141c74);
  local_80 = (_Base_ptr)pVar11.first._M_node;
  local_78 = pVar11.second;
  radioSizeLayout._4_4_ = 0;
  pmVar5 = std::
           map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
           ::operator[](&this->radioSizeMap,(key_type *)((long)&radioSizeLayout + 4));
  QAbstractButton::setChecked(SUB81(pmVar5,0));
  pQVar6 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar6);
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<1UL>_&,_std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
              *)this,(map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
                      *)&std::ranges::views::values,__self);
  __end1 = std::ranges::
           elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
           ::begin((elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
                    *)&__begin1);
  radio = (type *)std::ranges::
                  elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
                  ::end((elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
                         *)&__begin1);
  while( true ) {
    bVar4 = std::ranges::operator==(&__end1,(_Iterator<true> *)&radio);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    local_d0 = std::ranges::
               elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
               ::_Iterator<true>::operator*(&__end1);
    QBoxLayout::addSpacing((int)pQVar6);
    ptVar3 = local_d0;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_d4);
    QBoxLayout::addWidget((QWidget *)pQVar6,(int)ptVar3,(QFlags_conflict *)0x0);
    ptVar3 = local_d0;
    QString::QString((QString *)&radioSizeBox,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)ptVar3);
    QString::~QString((QString *)&radioSizeBox);
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>_>,_1UL>
    ::_Iterator<true>::operator++(&__end1);
  }
  QBoxLayout::addSpacing((int)pQVar6);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  local_111 = 1;
  QString::QString(&local_110,"Dimension of Board");
  QGroupBox::QGroupBox(pQVar7,(QString *)&local_110,(QWidget *)local_20);
  local_111 = 0;
  QString::~QString(&local_110);
  local_f8 = pQVar7;
  QWidget::setLayout((QLayout *)pQVar7);
  this_00 = &this->radioModeMap;
  local_118 = NUMERIC;
  pVar12 = std::
           map<BoardMode,QRadioButton,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
           ::emplace<BoardMode,char_const(&)[8]>
                     ((map<BoardMode,QRadioButton,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
                       *)this_00,&local_118,(char (*) [8])"Numeric");
  local_128 = (_Base_ptr)pVar12.first._M_node;
  local_120 = pVar12.second;
  local_12c = GRAPHIC;
  pVar12 = std::
           map<BoardMode,QRadioButton,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
           ::emplace<BoardMode,char_const(&)[8]>
                     ((map<BoardMode,QRadioButton,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
                       *)this_00,&local_12c,(char (*) [8])0x141491);
  local_140 = (_Base_ptr)pVar12.first._M_node;
  local_138 = pVar12.second;
  radioModeLayout._4_4_ = 0;
  pmVar8 = std::
           map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)((long)&radioModeLayout + 4));
  QAbstractButton::setChecked(SUB81(pmVar8,0));
  pQVar6 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar6);
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<1UL>_&,_std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
              *)&this->radioModeMap,
             (map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
              *)&std::ranges::views::values,__self_00);
  __end1_1 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
             ::begin((elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
                      *)&__begin1_1);
  radio_1 = (type *)std::ranges::
                    elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
                    ::end((elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
                           *)&__begin1_1);
  while( true ) {
    bVar4 = std::ranges::operator==(&__end1_1,(_Iterator<true> *)&radio_1);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    local_180 = std::ranges::
                elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
                ::_Iterator<true>::operator*(&__end1_1);
    QBoxLayout::addSpacing((int)pQVar6);
    ptVar2 = local_180;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_184);
    QBoxLayout::addWidget((QWidget *)pQVar6,(int)ptVar2,(QFlags_conflict *)0x0);
    ptVar2 = local_180;
    QString::QString((QString *)&radioModeBox,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)ptVar2);
    QString::~QString((QString *)&radioModeBox);
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>_>,_1UL>
    ::_Iterator<true>::operator++(&__end1_1);
  }
  QBoxLayout::addSpacing((int)pQVar6);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  pushRandom._7_1_ = 1;
  QString::QString(&local_1c0,"Kind of Board");
  QGroupBox::QGroupBox(pQVar7,(QString *)&local_1c0,(QWidget *)local_20);
  pushRandom._7_1_ = 0;
  QString::~QString(&local_1c0);
  local_1a8 = pQVar7;
  QWidget::setLayout((QLayout *)pQVar7);
  pQVar9 = (QPushButton *)operator_new(0x28);
  local_1e9 = 1;
  QString::QString(&local_1e8,"Generate Board");
  QPushButton::QPushButton(pQVar9,(QString *)&local_1e8,(QWidget *)local_20);
  local_1e9 = 0;
  QString::~QString(&local_1e8);
  local_1d0 = pQVar9;
  QString::QString(&local_208,"height:20px");
  QWidget::setStyleSheet((QString *)pQVar9);
  QString::~QString(&local_208);
  pQVar9 = local_1d0;
  pvVar10 = std::array<std::function<void_()>,_3UL>::operator[]
                      ((array<std::function<void_()>,_3UL> *)mainWindow_local,0);
  std::function<void_()>::function(&local_230,pvVar10);
  pushSolve = (QPushButton *)QAbstractButton::clicked;
  local_238 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_210,(offset_in_QAbstractButton_to_subr)pQVar9,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_210);
  std::function<void_()>::~function(&local_230);
  pQVar9 = (QPushButton *)operator_new(0x28);
  local_261 = 1;
  QString::QString(&local_260,"Solve Board");
  QPushButton::QPushButton(pQVar9,(QString *)&local_260,(QWidget *)local_20);
  local_261 = 0;
  QString::~QString(&local_260);
  local_248 = pQVar9;
  QString::QString(&local_280,"height:20px");
  QWidget::setStyleSheet((QString *)pQVar9);
  QString::~QString(&local_280);
  pQVar9 = local_248;
  pvVar10 = std::array<std::function<void_()>,_3UL>::operator[]
                      ((array<std::function<void_()>,_3UL> *)mainWindow_local,1);
  std::function<void_()>::function(&local_2a8,pvVar10);
  pushUndo = (QPushButton *)QAbstractButton::clicked;
  local_2b0 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_288,(offset_in_QAbstractButton_to_subr)pQVar9,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_288);
  std::function<void_()>::~function(&local_2a8);
  pQVar9 = (QPushButton *)operator_new(0x28);
  local_2d9 = 1;
  QString::QString(&local_2d8,"Undo Move");
  QPushButton::QPushButton(pQVar9,(QString *)&local_2d8,(QWidget *)local_20);
  local_2d9 = 0;
  QString::~QString(&local_2d8);
  local_2c0 = pQVar9;
  QString::QString(&local_2f8,"height:20px");
  QWidget::setStyleSheet((QString *)pQVar9);
  QString::~QString(&local_2f8);
  pQVar9 = local_2c0;
  pvVar10 = std::array<std::function<void_()>,_3UL>::operator[]
                      ((array<std::function<void_()>,_3UL> *)mainWindow_local,2);
  std::function<void_()>::function(&local_320,pvVar10);
  panelLayout = (QVBoxLayout *)QAbstractButton::clicked;
  local_328 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
            (local_300,(offset_in_QAbstractButton_to_subr)pQVar9,
             (function<void_()> *)QAbstractButton::clicked);
  QMetaObject::Connection::~Connection((Connection *)local_300);
  std::function<void_()>::~function(&local_320);
  pQVar6 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar6);
  local_338 = (QWidget *)pQVar6;
  QLayout::setContentsMargins((int)pQVar6,0x1e,0,0x14);
  pQVar9 = local_1d0;
  pQVar1 = local_338;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_33c);
  QBoxLayout::addWidget(pQVar1,(int)pQVar9,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_338);
  pQVar9 = local_248;
  pQVar1 = local_338;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_340);
  QBoxLayout::addWidget(pQVar1,(int)pQVar9,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_338);
  pQVar9 = local_2c0;
  pQVar1 = local_338;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_344);
  QBoxLayout::addWidget(pQVar1,(int)pQVar9,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_338);
  pQVar7 = local_f8;
  pQVar1 = local_338;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_348);
  QBoxLayout::addWidget(pQVar1,(int)pQVar7,(QFlags_conflict *)0x0);
  QBoxLayout::addStretch((int)local_338);
  pQVar7 = local_1a8;
  pQVar1 = local_338;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_34c);
  QBoxLayout::addWidget(pQVar1,(int)pQVar7,(QFlags_conflict *)0x0);
  QBoxLayout::addStretch((int)local_338);
  return (QVBoxLayout *)local_338;
}

Assistant:

QVBoxLayout* Panel::createLayout( std::array<std::function<void()>, 3>& panelSlots, QMainWindow* mainWindow )
{
    radioSizeMap.emplace( BoardSize::FOUR, "4" );
    radioSizeMap.emplace( BoardSize::FIVE, "5" );
    radioSizeMap.emplace( BoardSize::SIX, "6" );
    radioSizeMap.emplace( BoardSize::SEVEN, "7" );
    radioSizeMap[BoardSize::FOUR].setChecked( true );

    QVBoxLayout* radioSizeLayout = new QVBoxLayout();
    for( auto& radio : radioSizeMap | std::views::values )
    {
        radioSizeLayout->addSpacing( 10 );
        radioSizeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioSizeLayout->addSpacing( 30 );

    QGroupBox* radioSizeBox = new QGroupBox( "Dimension of Board", mainWindow );
    radioSizeBox->setLayout( radioSizeLayout );

    radioModeMap.emplace( BoardMode::NUMERIC, "Numeric" );
    radioModeMap.emplace( BoardMode::GRAPHIC, "Graphic" );
    radioModeMap[BoardMode::NUMERIC].setChecked( true );

    QVBoxLayout* radioModeLayout = new QVBoxLayout();
    for( auto& radio : radioModeMap | std::views::values )
    {
        radioModeLayout->addSpacing( 10 );
        radioModeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioModeLayout->addSpacing( 30 );

    QGroupBox* radioModeBox = new QGroupBox( "Kind of Board", mainWindow );
    radioModeBox->setLayout( radioModeLayout );

    QPushButton* pushRandom = new QPushButton( "Generate Board", mainWindow );
    pushRandom->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushRandom, &QPushButton::clicked, panelSlots[0] );

    QPushButton* pushSolve = new QPushButton( "Solve Board", mainWindow );
    pushSolve->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushSolve, &QPushButton::clicked, panelSlots[1] );

    QPushButton* pushUndo = new QPushButton( "Undo Move", mainWindow );
    pushUndo->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushUndo, &QPushButton::clicked, panelSlots[2] );

    QVBoxLayout* panelLayout = new QVBoxLayout();
    panelLayout->setContentsMargins( 30, 0, 20, 0 );
    panelLayout->addWidget( pushRandom );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushSolve );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushUndo );
    panelLayout->addSpacing( 30 );
    panelLayout->addWidget( radioSizeBox );
    panelLayout->addStretch();
    panelLayout->addWidget( radioModeBox );
    panelLayout->addStretch();
    return panelLayout;
}